

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

double ON_Font::AppleFontWeightTraitFromWeight(Weight font_weight)

{
  double local_38;
  double local_28;
  double apple_font_weight_trait;
  double w;
  double default_apple_font_weight_trait;
  Weight font_weight_local;
  
  apple_font_weight_trait = ((double)font_weight - 400.0) / 750.0;
  if (-1.0 <= apple_font_weight_trait) {
    if (1.0 < apple_font_weight_trait) {
      apple_font_weight_trait = 1.0;
    }
  }
  else {
    apple_font_weight_trait = -1.0;
  }
  if ((apple_font_weight_trait < -1.0) || (1.0 <= apple_font_weight_trait)) {
    apple_font_weight_trait = 0.0;
  }
  switch(font_weight) {
  case Unset:
    local_28 = 0.0;
    break;
  case Thin:
    local_28 = -0.4;
    break;
  case Ultralight:
    local_28 = apple_font_weight_trait;
    break;
  case Light:
    local_28 = apple_font_weight_trait;
    break;
  case Normal:
    local_28 = 0.0;
    break;
  case Medium:
    local_28 = apple_font_weight_trait;
    break;
  case Semibold:
    local_28 = apple_font_weight_trait;
    break;
  case Bold:
    local_28 = 0.4;
    break;
  case Ultrabold:
    local_28 = apple_font_weight_trait;
    break;
  case Heavy:
    local_28 = apple_font_weight_trait;
    break;
  default:
    local_28 = 0.0;
  }
  if ((local_28 < -1.0) || (1.0 < local_28)) {
    local_38 = 0.0;
  }
  else {
    local_38 = local_28;
  }
  return local_38;
}

Assistant:

double ON_Font::AppleFontWeightTraitFromWeight(
  ON_Font::Weight font_weight
)
{
  // These values are selected to optimize conversion of font weights between Windows and Apple platforms.
  // https://mcneel.myjetbrains.com/youtrack/issue/RH-37075


  const double default_apple_font_weight_trait = 0.0;

  double w = ((double)((int)static_cast<unsigned char>(font_weight)) - 400.0) / 750.0;
  if (w < -1.0)
    w = -1.0;
  else if (w > 1.0)
    w = 1.0;
  if (!(-1.0 <= w && w < 1.0))
    w = default_apple_font_weight_trait;
  
  double apple_font_weight_trait;
  switch (font_weight)
  {
  case ON_Font::Weight::Unset:
    apple_font_weight_trait = default_apple_font_weight_trait;
    break;
  case ON_Font::Weight::Thin:
    apple_font_weight_trait = -0.4;
    break;
  case ON_Font::Weight::Ultralight:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Light:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Normal:
    apple_font_weight_trait = 0.0;
    break;
  case ON_Font::Weight::Medium:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Semibold:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Bold:
    apple_font_weight_trait = 0.4;
    break;
  case ON_Font::Weight::Ultrabold:
    apple_font_weight_trait = w;
    break;
  case ON_Font::Weight::Heavy:
    apple_font_weight_trait = w;
    break;
  default:
    apple_font_weight_trait = default_apple_font_weight_trait;
    break;
  }

  // The valid value range is from -1.0 to 1.0. The value of 0.0 corresponds to the regular or medium font weight.
  return 
    (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0) 
    ? apple_font_weight_trait 
    : default_apple_font_weight_trait;
}